

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigInfo.cpp
# Opt level: O0

deInt32 __thiscall eglu::ConfigInfo::getAttribute(ConfigInfo *this,deUint32 attribute)

{
  InternalError *this_00;
  deUint32 attribute_local;
  ConfigInfo *this_local;
  
  if (attribute == 0x3020) {
    this_local._4_4_ = *(deInt32 *)this;
  }
  else if (attribute == 0x3021) {
    this_local._4_4_ = *(deInt32 *)(this + 0x14);
  }
  else if (attribute == 0x3022) {
    this_local._4_4_ = *(deInt32 *)(this + 0xc);
  }
  else if (attribute == 0x3023) {
    this_local._4_4_ = *(deInt32 *)(this + 8);
  }
  else if (attribute == 0x3024) {
    this_local._4_4_ = *(deInt32 *)(this + 4);
  }
  else if (attribute == 0x3025) {
    this_local._4_4_ = *(deInt32 *)(this + 0x34);
  }
  else if (attribute == 0x3026) {
    this_local._4_4_ = *(deInt32 *)(this + 100);
  }
  else if (attribute == 0x3027) {
    this_local._4_4_ = *(deInt32 *)(this + 0x28);
  }
  else if (attribute == 0x3028) {
    this_local._4_4_ = *(deInt32 *)(this + 0x2c);
  }
  else if (attribute == 0x3029) {
    this_local._4_4_ = *(deInt32 *)(this + 0x38);
  }
  else if (attribute == 0x302a) {
    this_local._4_4_ = *(deInt32 *)(this + 0x40);
  }
  else if (attribute == 0x302c) {
    this_local._4_4_ = *(deInt32 *)(this + 0x3c);
  }
  else if (attribute == 0x302d) {
    this_local._4_4_ = *(deInt32 *)(this + 0x4c);
  }
  else if (attribute == 0x302e) {
    this_local._4_4_ = *(deInt32 *)(this + 0x50);
  }
  else if (attribute == 0x302f) {
    this_local._4_4_ = *(deInt32 *)(this + 0x54);
  }
  else if (attribute == 0x3031) {
    this_local._4_4_ = *(deInt32 *)(this + 0x60);
  }
  else if (attribute == 0x3032) {
    this_local._4_4_ = *(deInt32 *)(this + 0x5c);
  }
  else if (attribute == 0x3033) {
    this_local._4_4_ = *(deInt32 *)(this + 0x68);
  }
  else if (attribute == 0x3034) {
    this_local._4_4_ = *(deInt32 *)(this + 0x6c);
  }
  else if (attribute == 0x3035) {
    this_local._4_4_ = *(deInt32 *)(this + 0x78);
  }
  else if (attribute == 0x3036) {
    this_local._4_4_ = *(deInt32 *)(this + 0x74);
  }
  else if (attribute == 0x3037) {
    this_local._4_4_ = *(deInt32 *)(this + 0x70);
  }
  else if (attribute == 0x3039) {
    this_local._4_4_ = *(deInt32 *)(this + 0x1c);
  }
  else if (attribute == 0x303a) {
    this_local._4_4_ = *(deInt32 *)(this + 0x20);
  }
  else if (attribute == 0x303b) {
    this_local._4_4_ = *(deInt32 *)(this + 0x48);
  }
  else if (attribute == 0x303c) {
    this_local._4_4_ = *(deInt32 *)(this + 0x44);
  }
  else if (attribute == 0x303d) {
    this_local._4_4_ = *(deInt32 *)(this + 0x10);
  }
  else if (attribute == 0x303e) {
    this_local._4_4_ = *(deInt32 *)(this + 0x18);
  }
  else if (attribute == 0x303f) {
    this_local._4_4_ = *(deInt32 *)(this + 0x24);
  }
  else if (attribute == 0x3040) {
    this_local._4_4_ = *(deInt32 *)(this + 0x58);
  }
  else if (attribute == 0x3042) {
    this_local._4_4_ = *(deInt32 *)(this + 0x30);
  }
  else if (attribute == 0x3301) {
    this_local._4_4_ = *(deInt32 *)(this + 0x7c);
  }
  else if (attribute == 0x330a) {
    this_local._4_4_ = *(deInt32 *)(this + 0x8c);
  }
  else if (attribute == 0x3311) {
    this_local._4_4_ = *(deInt32 *)(this + 0x80);
  }
  else if (attribute == 0x3312) {
    this_local._4_4_ = *(deInt32 *)(this + 0x84);
  }
  else if (attribute == 0x3317) {
    this_local._4_4_ = *(deInt32 *)(this + 0x88);
  }
  else if (attribute == 0x331a) {
    this_local._4_4_ = *(deInt32 *)(this + 0x90);
  }
  else {
    if (attribute != 0x3339) {
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_00,"Unknown attribute",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluConfigInfo.cpp"
                 ,0x53);
      __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    this_local._4_4_ = *(deInt32 *)(this + 0x94);
  }
  return this_local._4_4_;
}

Assistant:

deInt32 ConfigInfo::getAttribute (deUint32 attribute) const
{
	switch (attribute)
	{
		case EGL_BUFFER_SIZE:				return bufferSize;
		case EGL_RED_SIZE:					return redSize;
		case EGL_GREEN_SIZE:				return greenSize;
		case EGL_BLUE_SIZE:					return blueSize;
		case EGL_LUMINANCE_SIZE:			return luminanceSize;
		case EGL_ALPHA_SIZE:				return alphaSize;
		case EGL_ALPHA_MASK_SIZE:			return alphaMaskSize;
		case EGL_BIND_TO_TEXTURE_RGB:		return bindToTextureRGB;
		case EGL_BIND_TO_TEXTURE_RGBA:		return bindToTextureRGBA;
		case EGL_COLOR_BUFFER_TYPE:			return colorBufferType;
		case EGL_CONFIG_CAVEAT:				return configCaveat;
		case EGL_CONFIG_ID:					return configId;
		case EGL_CONFORMANT:				return conformant;
		case EGL_DEPTH_SIZE:				return depthSize;
		case EGL_LEVEL:						return level;
		case EGL_MAX_PBUFFER_WIDTH:			return maxPbufferWidth;
		case EGL_MAX_PBUFFER_HEIGHT:		return maxPbufferHeight;
		case EGL_MAX_SWAP_INTERVAL:			return maxSwapInterval;
		case EGL_MIN_SWAP_INTERVAL:			return minSwapInterval;
		case EGL_NATIVE_RENDERABLE:			return nativeRenderable;
		case EGL_NATIVE_VISUAL_ID:			return nativeVisualId;
		case EGL_NATIVE_VISUAL_TYPE:		return nativeVisualType;
		case EGL_RENDERABLE_TYPE:			return renderableType;
		case EGL_SAMPLE_BUFFERS:			return sampleBuffers;
		case EGL_SAMPLES:					return samples;
		case EGL_STENCIL_SIZE:				return stencilSize;
		case EGL_SURFACE_TYPE:				return surfaceType;
		case EGL_TRANSPARENT_TYPE:			return transparentType;
		case EGL_TRANSPARENT_RED_VALUE:		return transparentRedValue;
		case EGL_TRANSPARENT_GREEN_VALUE:	return transparentGreenValue;
		case EGL_TRANSPARENT_BLUE_VALUE:	return transparentBlueValue;

		// EGL_EXT_yuv_surface
		case EGL_YUV_ORDER_EXT:				return yuvOrder;
		case EGL_YUV_NUMBER_OF_PLANES_EXT:	return yuvNumberOfPlanes;
		case EGL_YUV_SUBSAMPLE_EXT:			return yuvSubsample;
		case EGL_YUV_DEPTH_RANGE_EXT:		return yuvDepthRange;
		case EGL_YUV_CSC_STANDARD_EXT:		return yuvCscStandard;
		case EGL_YUV_PLANE_BPP_EXT:			return yuvPlaneBpp;

		// EGL_EXT_pixel_format_float
		case EGL_COLOR_COMPONENT_TYPE_EXT:	return colorComponentType;

		default:							TCU_THROW(InternalError, "Unknown attribute");
	}
}